

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_alert::torrent_alert
          (torrent_alert *this,stack_allocator *alloc,torrent_handle *h)

{
  bool bVar1;
  allocation_slot aVar2;
  difference_type in_RCX;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_char> in;
  span<const_char> in_00;
  shared_ptr<libtorrent::aux::torrent> t;
  string local_58;
  string name_str;
  
  alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__torrent_alert_004c5280;
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&this->handle,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)h);
  (this->m_alloc)._M_data = alloc;
  (this->m_name_idx).m_idx = -1;
  torrent_handle::native_handle((torrent_handle *)&t);
  if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    aVar2 = aux::stack_allocator::copy_string(alloc,"");
    (this->m_name_idx).m_idx = aVar2.m_idx;
  }
  else {
    aux::torrent::name_abi_cxx11_
              (&name_str,
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (name_str._M_string_length == 0) {
      bVar1 = info_hash_t::has_v2(&(t.
                                    super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_info_hash);
      if (bVar1) {
        in.m_len = in_RCX;
        in.m_ptr = (char *)0x20;
        aux::to_hex_abi_cxx11_
                  (&local_58,
                   (aux *)&((t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_info_hash).v2,in);
        str_00._M_str = local_58._M_dataplus._M_p;
        str_00._M_len = local_58._M_string_length;
        aVar2 = aux::stack_allocator::copy_string(alloc,str_00);
      }
      else {
        in_00.m_len = in_RCX;
        in_00.m_ptr = (char *)0x14;
        aux::to_hex_abi_cxx11_
                  (&local_58,
                   (aux *)&(t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->m_info_hash,in_00);
        str_01._M_str = local_58._M_dataplus._M_p;
        str_01._M_len = local_58._M_string_length;
        aVar2 = aux::stack_allocator::copy_string(alloc,str_01);
      }
      (this->m_name_idx).m_idx = aVar2.m_idx;
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      str._M_str = name_str._M_dataplus._M_p;
      str._M_len = name_str._M_string_length;
      aVar2 = aux::stack_allocator::copy_string(alloc,str);
      (this->m_name_idx).m_idx = aVar2.m_idx;
    }
    ::std::__cxx11::string::~string((string *)&name_str);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

torrent_alert::torrent_alert(aux::stack_allocator& alloc
		, torrent_handle const& h)
		: handle(h)
		, m_alloc(alloc)
	{
		auto t = h.native_handle();
		if (t)
		{
			std::string name_str = t->name();
			if (!name_str.empty())
			{
				m_name_idx = alloc.copy_string(name_str);
			}
			else
			{
				if (t->info_hash().has_v2())
					m_name_idx = alloc.copy_string(aux::to_hex(t->info_hash().v2));
				else
					m_name_idx = alloc.copy_string(aux::to_hex(t->info_hash().v1));
			}
		}
		else
		{
			m_name_idx = alloc.copy_string("");
		}

#if TORRENT_ABI_VERSION == 1
		name = m_alloc.get().ptr(m_name_idx);
#endif
	}